

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

void output_token_noswap(Context_conflict2 *ctx,uint32 token)

{
  int iVar1;
  undefined8 local_30;
  SourcePos srcpos;
  char *fname;
  uint pos;
  uint32 token_local;
  Context_conflict2 *ctx_local;
  
  fname._4_4_ = token;
  _pos = ctx;
  iVar1 = isfail(ctx);
  if (iVar1 == 0) {
    buffer_append(_pos->output,(void *)((long)&fname + 4),4);
    fname._0_4_ = 0;
    srcpos._8_8_ = preprocessor_sourcepos(_pos->preprocessor,(uint *)&fname);
    memset(&local_30,0,0x10);
    srcpos.filename._0_4_ = fname._0_4_;
    local_30._0_4_ = srcpos.line;
    local_30._4_4_ = srcpos._12_4_;
    buffer_append(_pos->token_to_source,&local_30,0x10);
  }
  return;
}

Assistant:

static void output_token_noswap(Context *ctx, const uint32 token)
{
    if (!isfail(ctx))
    {
        buffer_append(ctx->output, &token, sizeof (token));

        // We only need a list of these that grows throughout processing, and
        //  is flattened for reference at the end of the run, so we use a
        //  Buffer. It's sneaky!
        unsigned int pos = 0;
        const char *fname = preprocessor_sourcepos(ctx->preprocessor, &pos);
        SourcePos srcpos;
        memset(&srcpos, '\0', sizeof (SourcePos));
        srcpos.line = pos;
        srcpos.filename = fname;  // cached in preprocessor!
        buffer_append(ctx->token_to_source, &srcpos, sizeof (SourcePos));
    } // if
}